

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall
MakefileGenerator::mkdir_p_asstring(MakefileGenerator *this,QString *dir,bool escape)

{
  byte bVar1;
  char (*pacVar2) [2];
  byte in_CL;
  QString *in_RDX;
  char (*in_RSI) [2];
  QStringBuilder<const_char_(&)[2],_QString> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_char_(&)[2],_QString> *pQVar3;
  int fieldWidth;
  uint6 in_stack_ffffffffffffff68;
  byte bVar4;
  QChar local_72;
  undefined1 local_70 [14];
  QChar in_stack_ffffffffffffff9e;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  pacVar2 = in_RSI + 0x44;
  fieldWidth = (int)((ulong)pacVar2 >> 0x20);
  bVar4 = 0;
  pQVar3 = in_RDI;
  if (bVar1 == 0) {
    QString::QString((QString *)in_RDI,(QString *)in_RDI);
  }
  else {
    Option::fixPathToTargetOS
              ((QString *)(CONCAT17(in_CL,(uint7)in_stack_ffffffffffffff68) & 0x1ffffffffffffff),
               SUB81((ulong)pacVar2 >> 0x38,0),SUB81((ulong)pacVar2 >> 0x30,0));
    bVar4 = 1;
    (**(code **)(*(long *)in_RSI + 0x60))(local_58,in_RSI,local_70);
  }
  QChar::QChar<char16_t,_true>(&local_72,L' ');
  QString::arg<QString,_true>
            (in_RDX,(QString *)CONCAT17(bVar1,CONCAT16(bVar4,in_stack_ffffffffffffff68)),fieldWidth,
             in_stack_ffffffffffffff9e);
  ::operator+(in_RSI,(QString *)pQVar3);
  ::QStringBuilder::operator_cast_to_QString(in_RDI);
  QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[2],_QString> *)0x173cf1);
  QString::~QString((QString *)0x173cfb);
  QString::~QString((QString *)0x173d05);
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x173d18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)pQVar3;
}

Assistant:

QString MakefileGenerator::mkdir_p_asstring(const QString &dir, bool escape) const
{
    return "@" + makedir.arg(
        escape ? escapeFilePath(Option::fixPathToTargetOS(dir, false, false)) : dir);
}